

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::ArchiveShellCommand::configureInputs
          (ArchiveShellCommand *this,ConfigureContext *ctx,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  pointer ppBVar1;
  BuildNode *pBVar2;
  pointer pcVar3;
  BuildNode **input;
  pointer ppBVar4;
  Child local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  ConfigureContext *local_38;
  
  local_38 = ctx;
  llbuild::buildsystem::ExternalCommand::configureInputs(&this->super_ExternalCommand,ctx,value);
  ppBVar4 = (this->super_ExternalCommand).super_Command.inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_ExternalCommand).super_Command.inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar4 != ppBVar1) {
    do {
      pBVar2 = *ppBVar4;
      if (pBVar2->type != Virtual) {
        pcVar3 = (pBVar2->super_Node).name._M_dataplus._M_p;
        local_58.twine = (Twine *)&local_48;
        if (pcVar3 == (pointer)0x0) {
          local_50 = 0;
          local_48 = 0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,pcVar3,pcVar3 + (pBVar2->super_Node).name._M_string_length)
          ;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->archiveInputs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
        if (local_58.twine != (Twine *)&local_48) {
          operator_delete(local_58.twine,CONCAT71(uStack_47,local_48) + 1);
        }
      }
      ppBVar4 = ppBVar4 + 1;
    } while (ppBVar4 != ppBVar1);
  }
  if ((this->archiveInputs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->archiveInputs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    llvm::Twine::Twine((Twine *)&local_58,"missing expected input");
    llbuild::buildsystem::ConfigureContext::error(local_38,(Twine *)&local_58);
  }
  return;
}

Assistant:

virtual void configureInputs(const ConfigureContext& ctx,
                                const std::vector<Node*>& value) override {
    ExternalCommand::configureInputs(ctx, value);

    for (const auto& input: getInputs()) {
      if (!input->isVirtual()) {
        archiveInputs.push_back(input->getName());
      }
    }
    if (archiveInputs.empty()) {
      ctx.error("missing expected input");
    }
  }